

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

Page * pager_fetch_page(Pager *pPager,pgno page_num)

{
  Page *pPVar1;
  Page **ppPVar2;
  
  if (pPager->nPage != 0) {
    ppPVar2 = pPager->apHash + ((uint)page_num & pPager->nSize - 1);
    while (pPVar1 = *ppPVar2, pPVar1 != (Page *)0x0) {
      if (pPVar1->pgno == page_num) {
        return pPVar1;
      }
      ppPVar2 = &pPVar1->pNextCollide;
    }
  }
  return (Page *)0x0;
}

Assistant:

static Page * pager_fetch_page(Pager *pPager,pgno page_num)
{
	Page *pEntry;
	if( pPager->nPage < 1 ){
		/* Don't bother hashing */
		return 0;
	}
	/* Perform the lookup */
	pEntry = pPager->apHash[PAGE_HASH(page_num) & (pPager->nSize - 1)];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->pgno == page_num ){
			return pEntry;
		}
		/* Point to the next entry in the colission chain */
		pEntry = pEntry->pNextCollide;
	}
	/* No such page */
	return 0;
}